

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

WaitForkStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WaitForkStatementSyntax,slang::syntax::WaitForkStatementSyntax_const&>
          (BumpAllocator *this,WaitForkStatementSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  WaitForkStatementSyntax *pWVar18;
  
  pWVar18 = (WaitForkStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((WaitForkStatementSyntax *)this->endPtr < pWVar18 + 1) {
    pWVar18 = (WaitForkStatementSyntax *)allocateSlow(this,0x88,8);
  }
  else {
    this->head->current = (byte *)(pWVar18 + 1);
  }
  (pWVar18->super_StatementSyntax).super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).super_SyntaxNode.previewNode;
  uVar6 = *(undefined4 *)&(args->super_StatementSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_StatementSyntax).super_SyntaxNode.parent;
  (pWVar18->super_StatementSyntax).super_SyntaxNode.kind =
       (args->super_StatementSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pWVar18->super_StatementSyntax).super_SyntaxNode.field_0x4 = uVar6;
  (pWVar18->super_StatementSyntax).super_SyntaxNode.parent = pSVar1;
  (pWVar18->super_StatementSyntax).label = (args->super_StatementSyntax).label;
  (pWVar18->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar6 = *(undefined4 *)
           &(args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pWVar18->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pWVar18->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 =
       uVar6;
  (pWVar18->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pWVar18->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005b7e60;
  (pWVar18->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_StatementSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pWVar18->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_StatementSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pWVar18->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pWVar18->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005bad98;
  uVar7 = (args->wait).field_0x2;
  NVar8.raw = (args->wait).numFlags.raw;
  uVar9 = (args->wait).rawLen;
  pIVar3 = (args->wait).info;
  TVar10 = (args->fork).kind;
  uVar11 = (args->fork).field_0x2;
  NVar12.raw = (args->fork).numFlags.raw;
  uVar13 = (args->fork).rawLen;
  pIVar4 = (args->fork).info;
  TVar14 = (args->semi).kind;
  uVar15 = (args->semi).field_0x2;
  NVar16.raw = (args->semi).numFlags.raw;
  uVar17 = (args->semi).rawLen;
  pIVar5 = (args->semi).info;
  (pWVar18->wait).kind = (args->wait).kind;
  (pWVar18->wait).field_0x2 = uVar7;
  (pWVar18->wait).numFlags = (NumericTokenFlags)NVar8.raw;
  (pWVar18->wait).rawLen = uVar9;
  (pWVar18->wait).info = pIVar3;
  (pWVar18->fork).kind = TVar10;
  (pWVar18->fork).field_0x2 = uVar11;
  (pWVar18->fork).numFlags = (NumericTokenFlags)NVar12.raw;
  (pWVar18->fork).rawLen = uVar13;
  (pWVar18->fork).info = pIVar4;
  (pWVar18->semi).kind = TVar14;
  (pWVar18->semi).field_0x2 = uVar15;
  (pWVar18->semi).numFlags = (NumericTokenFlags)NVar16.raw;
  (pWVar18->semi).rawLen = uVar17;
  (pWVar18->semi).info = pIVar5;
  return pWVar18;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }